

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_columns.cpp
# Opt level: O3

bool __thiscall
duckdb::SetColumns::IsCandidateUnacceptable
          (SetColumns *this,idx_t num_cols,bool null_padding,bool ignore_errors,
          bool last_value_always_empty)

{
  vector<duckdb::LogicalType,_true> *pvVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong uVar4;
  
  pvVar1 = this->types;
  if (pvVar1 != (vector<duckdb::LogicalType,_true> *)0x0) {
    pLVar2 = (pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar3 = (pvVar1->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((pLVar2 != pLVar3 && !ignore_errors) &&
       (uVar4 = ((long)pLVar3 - (long)pLVar2 >> 3) * -0x5555555555555555, uVar4 - num_cols != 0)) {
      return (!null_padding || num_cols <= uVar4) && last_value_always_empty + uVar4 != num_cols;
    }
  }
  return false;
}

Assistant:

bool SetColumns::IsCandidateUnacceptable(const idx_t num_cols, bool null_padding, bool ignore_errors,
                                         bool last_value_always_empty) const {
	if (!IsSet() || ignore_errors) {
		// We can't say its unacceptable if it's not set or if we ignore errors
		return false;
	}
	idx_t size = Size();
	// If the columns are set and there is a mismatch with the expected number of columns, with null_padding and
	// ignore_errors not set, we don't have a suitable candidate.
	// Note that we compare with max_columns_found + 1, because some broken files have the behaviour where two
	// columns are represented as: | col 1 | col_2 |
	if (num_cols == size || num_cols == size + last_value_always_empty) {
		// Good Candidate
		return false;
	}
	// if we detected more columns than we have set, it's all good because we can null-pad them
	if (null_padding && num_cols > size) {
		return false;
	}
	// Unacceptable
	return true;
}